

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::FormalArgumentSymbol::FormalArgumentSymbol
          (FormalArgumentSymbol *this,string_view name,SourceLocation loc,
          ArgumentDirection direction,VariableLifetime lifetime)

{
  string_view name_00;
  long in_RDI;
  undefined4 in_R8D;
  VariableLifetime unaff_retaddr;
  SymbolKind unaff_retaddr_00;
  VariableSymbol *in_stack_00000008;
  SourceLocation in_stack_00000010;
  undefined8 in_stack_00000018;
  
  name_00._M_str._0_4_ = lifetime;
  name_00._M_len = in_stack_00000018;
  name_00._M_str._4_4_ = direction;
  VariableSymbol::VariableSymbol
            (in_stack_00000008,unaff_retaddr_00,name_00,in_stack_00000010,unaff_retaddr);
  *(undefined4 *)(in_RDI + 0x158) = in_R8D;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  return;
}

Assistant:

FormalArgumentSymbol::FormalArgumentSymbol(std::string_view name, SourceLocation loc,
                                           ArgumentDirection direction, VariableLifetime lifetime) :
    VariableSymbol(SymbolKind::FormalArgument, name, loc, lifetime), direction(direction) {
}